

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option,
          SIMDReplaceOp rest,SIMDReplaceOp rest_1)

{
  mapped_type *this_00;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar1;
  FeatureSet local_38;
  SIMDReplaceOp local_34;
  FeatureSet feature_local;
  SIMDReplaceOp option_local;
  
  _local_38 = CONCAT44(option,feature.features);
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,&local_38);
  std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>::push_back
            (this_00,&local_34);
  pFVar1 = add<wasm::SIMDReplaceOp>(this,local_38,rest,rest_1);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }